

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PacketCompression.cpp
# Opt level: O0

Result __thiscall
tonk::MessageCompressor::Initialize(MessageCompressor *this,uint maxCompressedMessagesBytes)

{
  ZSTD_parameters params;
  uint uVar1;
  ZSTD_CCtx *pZVar2;
  char *pcVar3;
  size_t sVar4;
  undefined4 in_EDX;
  long in_RSI;
  ErrorResult *in_RDI;
  size_t blockSizeBytes;
  size_t icsResult;
  ZSTD_parameters zParams;
  size_t estimatedPacketSize;
  ErrorCodeT in_stack_fffffffffffffd70;
  undefined8 in_stack_fffffffffffffd78;
  ErrorType type;
  string *in_stack_fffffffffffffd80;
  char *in_stack_fffffffffffffd88;
  ErrorResult *in_stack_fffffffffffffd90;
  size_t in_stack_fffffffffffffdd0;
  ErrorResult *pEVar5;
  unsigned_long_long in_stack_fffffffffffffdd8;
  undefined8 in_stack_fffffffffffffde0;
  int compressionLevel;
  allocator *paVar6;
  allocator local_1c9;
  string local_1c8 [32];
  size_t local_1a8;
  allocator local_199;
  string local_198 [16];
  unsigned_long_long in_stack_fffffffffffffe78;
  size_t in_stack_fffffffffffffe80;
  void *in_stack_fffffffffffffe88;
  ZSTD_CCtx *in_stack_fffffffffffffe90;
  undefined8 uStack_168;
  ErrorType EStack_164;
  string *in_stack_fffffffffffffea0;
  char *in_stack_fffffffffffffea8;
  undefined8 in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb8;
  undefined8 in_stack_fffffffffffffebc;
  uint in_stack_fffffffffffffec4;
  undefined1 local_128 [28];
  undefined4 local_10c;
  undefined4 local_108;
  undefined4 local_104;
  ulong local_100;
  allocator local_e1;
  string local_e0 [72];
  undefined8 local_98;
  undefined4 local_8c;
  string *local_88;
  char *local_80;
  size_t local_60;
  undefined4 local_54;
  string *local_50;
  char *local_48;
  undefined8 local_28;
  undefined4 local_1c;
  string *local_18;
  char *local_10;
  
  type = (ErrorType)((ulong)in_stack_fffffffffffffd78 >> 0x20);
  compressionLevel = (int)((ulong)in_stack_fffffffffffffde0 >> 0x20);
  *(undefined4 *)(in_RSI + 0x5dd0) = in_EDX;
  pZVar2 = ZSTD_createCCtx();
  *(ZSTD_CCtx **)(in_RSI + 0x5dc8) = pZVar2;
  if (*(long *)(in_RSI + 0x5dc8) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_e0,"ZSTD_createCCtx failed",&local_e1);
    local_80 = "SessionOutgoing::Initialize";
    local_88 = local_e0;
    local_8c = 6;
    local_98 = 2;
    pcVar3 = (char *)operator_new(0x38);
    ErrorResult::ErrorResult
              (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,in_stack_fffffffffffffd80,type,
               in_stack_fffffffffffffd70);
    in_RDI->Source = pcVar3;
    std::__cxx11::string::~string(local_e0);
    std::allocator<char>::~allocator((allocator<char> *)&local_e1);
  }
  else {
    local_100 = (ulong)*(uint *)(in_RSI + 0x5dd0);
    ZSTD_getCParams(compressionLevel,in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0);
    local_108 = 0;
    local_10c = 0;
    local_104 = 1;
    memcpy(&stack0xfffffffffffffe88,local_128,0x28);
    params.cParams._8_8_ = in_stack_fffffffffffffea8;
    params.cParams._0_8_ = in_stack_fffffffffffffea0;
    params.cParams.searchLength = (int)in_stack_fffffffffffffeb0;
    params.cParams.targetLength = (int)((ulong)in_stack_fffffffffffffeb0 >> 0x20);
    params.cParams.strategy = in_stack_fffffffffffffeb8;
    params.fParams.contentSizeFlag = (int)in_stack_fffffffffffffebc;
    params.fParams.checksumFlag = (int)((ulong)in_stack_fffffffffffffebc >> 0x20);
    params.fParams.noDictIDFlag = in_stack_fffffffffffffec4;
    sVar4 = ZSTD_compressBegin_advanced
                      (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,in_stack_fffffffffffffe80
                       ,params,in_stack_fffffffffffffe78);
    uVar1 = ZSTD_isError(0x1cfe40);
    if (uVar1 == 0) {
      local_1a8 = ZSTD_getBlockSize(*(ZSTD_CCtx **)(in_RSI + 0x5dc8));
      if (local_1a8 < *(uint *)(in_RSI + 0x5dd0)) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_1c8,"Zstd block size is too small",&local_1c9);
        local_10 = "SessionOutgoing::Initialize";
        local_18 = local_1c8;
        local_1c = 6;
        local_28 = 2;
        pcVar3 = (char *)operator_new(0x38);
        ErrorResult::ErrorResult
                  (in_stack_fffffffffffffd90,in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,
                   EStack_164,(ErrorCodeT)in_stack_fffffffffffffe90);
        in_RDI->Source = pcVar3;
        std::__cxx11::string::~string(local_1c8);
        std::allocator<char>::~allocator((allocator<char> *)&local_1c9);
      }
      else {
        Result::Success();
      }
    }
    else {
      paVar6 = &local_199;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_198,"ZSTD_compressBegin_advanced failed",paVar6);
      local_48 = "SessionOutgoing::Initialize";
      local_50 = local_198;
      local_54 = 6;
      pEVar5 = in_RDI;
      local_60 = sVar4;
      pcVar3 = (char *)operator_new(0x38);
      ErrorResult::ErrorResult
                (in_stack_fffffffffffffd90,in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,
                 EStack_164,(ErrorCodeT)in_stack_fffffffffffffe90);
      pEVar5->Source = pcVar3;
      std::__cxx11::string::~string(local_198);
      std::allocator<char>::~allocator((allocator<char> *)&local_199);
    }
  }
  return (Result)in_RDI;
}

Assistant:

Result MessageCompressor::Initialize(unsigned maxCompressedMessagesBytes)
{
    MaxCompressedMessagesBytes = maxCompressedMessagesBytes;
    CCtx = ZSTD_createCCtx();

    if (!CCtx) {
        return Result("SessionOutgoing::Initialize", "ZSTD_createCCtx failed", ErrorType::Zstd);
    }

    const size_t estimatedPacketSize = MaxCompressedMessagesBytes;

    ZSTD_parameters zParams;

    zParams.cParams = ZSTD_getCParams(
        kCompressionLevel,
        estimatedPacketSize,
        kCompressionDictBytes);

    zParams.fParams.checksumFlag = 0;
    zParams.fParams.contentSizeFlag = 0;
    zParams.fParams.noDictIDFlag = 1;

    const size_t icsResult = ZSTD_compressBegin_advanced(
        CCtx,
        nullptr,
        0,
        zParams,
        ZSTD_CONTENTSIZE_UNKNOWN);

    if (0 != ZSTD_isError(icsResult)) {
        TONK_DEBUG_BREAK();
        return Result("SessionOutgoing::Initialize", "ZSTD_compressBegin_advanced failed", ErrorType::Zstd, icsResult);
    }

    const size_t blockSizeBytes = ZSTD_getBlockSize(CCtx);
    if (blockSizeBytes < MaxCompressedMessagesBytes) {
        return Result("SessionOutgoing::Initialize", "Zstd block size is too small", ErrorType::Zstd);
    }

    return Result::Success();
}